

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11authfile.c
# Opt level: O1

void x11_get_auth_from_authfile(X11Display *disp,char *authfilename)

{
  BinarySourceError BVar1;
  byte bVar2;
  BinarySource *pBVar3;
  size_t __n;
  _Bool _Var4;
  _Bool _Var5;
  uint uVar6;
  FILE *__stream;
  char *str;
  void *__ptr;
  size_t sVar7;
  char *__nptr;
  uchar *__dest;
  int iVar8;
  uint uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  ptrlen pVar12;
  ptrlen pVar13;
  ptrlen pVar14;
  BinarySource src [1];
  char buf [4];
  byte local_b4;
  int *local_a8;
  size_t local_a0;
  BinarySource local_88;
  undefined4 local_58;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  ptrlen local_40;
  
  if (disp->unixdomain == false) {
    _Var4 = sk_address_is_local(disp->addr);
  }
  else {
    _Var4 = false;
  }
  __stream = fopen(authfilename,"rb");
  if (__stream != (FILE *)0x0) {
    str = get_hostname();
    bVar2 = 0;
    __ptr = safemalloc(0x8000c,1,0);
    sVar7 = fread(__ptr,1,0x8000c,__stream);
    local_88.len = (size_t)(int)sVar7;
    local_88.binarysource_ = &local_88;
    local_88.pos = 0;
    local_88.err = BSE_NO_ERROR;
    local_b4 = _Var4 ^ 1;
    local_88.data = __ptr;
    do {
      if (bVar2 != 0) break;
      if (0x40005 < local_88.pos) {
        iVar8 = (int)sVar7 - (int)local_88.pos;
        sVar7 = (size_t)iVar8;
        memcpy(__ptr,(void *)(local_88.pos + (long)__ptr),sVar7);
        sVar7 = fread((void *)((long)__ptr + sVar7),1,0x8000c - sVar7,__stream);
        uVar9 = iVar8 + (int)sVar7;
        sVar7 = (size_t)uVar9;
        local_88.len = (size_t)(int)uVar9;
        local_88.pos = 0;
        local_88.err = BSE_NO_ERROR;
        local_88.binarysource_ = &local_88;
        local_88.data = __ptr;
      }
      uVar9 = BinarySource_get_uint16(local_88.binarysource_);
      pBVar3 = local_88.binarysource_;
      uVar6 = BinarySource_get_uint16((local_88.binarysource_)->binarysource_);
      pVar12 = BinarySource_get_data(pBVar3->binarysource_,(ulong)uVar6);
      pBVar3 = local_88.binarysource_;
      uVar6 = BinarySource_get_uint16((local_88.binarysource_)->binarysource_);
      pVar13 = BinarySource_get_data(pBVar3->binarysource_,(ulong)uVar6);
      __nptr = mkstr(pVar13);
      if (*__nptr == '\0') {
        iVar8 = -1;
      }
      else {
        iVar8 = atoi(__nptr);
      }
      safefree(__nptr);
      pBVar3 = local_88.binarysource_;
      uVar6 = BinarySource_get_uint16((local_88.binarysource_)->binarysource_);
      pVar13 = BinarySource_get_data(pBVar3->binarysource_,(ulong)uVar6);
      pBVar3 = local_88.binarysource_;
      uVar6 = BinarySource_get_uint16((local_88.binarysource_)->binarysource_);
      pVar14 = BinarySource_get_data(pBVar3->binarysource_,(ulong)uVar6);
      BVar1 = (local_88.binarysource_)->err;
      if (((BVar1 == BSE_NO_ERROR) && (-1 < disp->displaynum)) &&
         (iVar8 < 0 || disp->displaynum == iVar8)) {
        lVar10 = 1;
        local_40 = pVar14;
        do {
          _Var5 = ptrlen_eq_string(pVar13,x11_authnames[lVar10]);
          if (_Var5) goto LAB_0013f207;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        lVar10 = 3;
LAB_0013f207:
        if ((int)lVar10 != 3) {
          if (uVar9 == 0x100) {
            if (disp->unixdomain == false) {
              if ((str != (char *)0x0 & _Var4) != 0) goto LAB_0013f2f3;
            }
            else if (str != (char *)0x0) {
LAB_0013f2f3:
              _Var5 = ptrlen_eq_string(pVar12,str);
              if (_Var5) {
                bVar2 = 1;
              }
              goto LAB_0013f329;
            }
LAB_0013f327:
            _Var5 = false;
          }
          else {
            local_a8 = (int *)pVar12.ptr;
            local_a0 = pVar12.len;
            if (uVar9 == 6) {
              if (((disp->unixdomain == false) && (iVar8 = sk_addrtype(disp->addr), iVar8 == 2)) &&
                 (sk_addrcopy(disp->addr,(char *)&local_58), local_a0 == 0x10)) {
                auVar11[0] = -((char)*local_a8 == (char)local_58);
                auVar11[1] = -(*(char *)((long)local_a8 + 1) == local_58._1_1_);
                auVar11[2] = -(*(char *)((long)local_a8 + 2) == local_58._2_1_);
                auVar11[3] = -(*(char *)((long)local_a8 + 3) == local_58._3_1_);
                auVar11[4] = -((char)local_a8[1] == cStack_54);
                auVar11[5] = -(*(char *)((long)local_a8 + 5) == cStack_53);
                auVar11[6] = -(*(char *)((long)local_a8 + 6) == cStack_52);
                auVar11[7] = -(*(char *)((long)local_a8 + 7) == cStack_51);
                auVar11[8] = -((char)local_a8[2] == cStack_50);
                auVar11[9] = -(*(char *)((long)local_a8 + 9) == cStack_4f);
                auVar11[10] = -(*(char *)((long)local_a8 + 10) == cStack_4e);
                auVar11[0xb] = -(*(char *)((long)local_a8 + 0xb) == cStack_4d);
                auVar11[0xc] = -((char)local_a8[3] == cStack_4c);
                auVar11[0xd] = -(*(char *)((long)local_a8 + 0xd) == cStack_4b);
                auVar11[0xe] = -(*(char *)((long)local_a8 + 0xe) == cStack_4a);
                auVar11[0xf] = -(*(char *)((long)local_a8 + 0xf) == cStack_49);
                _Var5 = (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                                (ushort)(auVar11[0xf] >> 7) << 0xf) == 0xffff;
                goto LAB_0013f2c7;
              }
              goto LAB_0013f327;
            }
            if (((uVar9 != 0) || (disp->unixdomain != false)) ||
               ((iVar8 = sk_addrtype(disp->addr), iVar8 != 1 ||
                (sk_addrcopy(disp->addr,(char *)&local_58), local_a0 != 4)))) goto LAB_0013f327;
            _Var5 = *local_a8 == local_58;
LAB_0013f2c7:
            if (_Var5) {
              bVar2 = local_b4;
            }
          }
LAB_0013f329:
          if (_Var5 != false) {
            disp->localauthproto = (int)lVar10;
            safefree(disp->localauthdata);
            pVar12 = local_40;
            __n = local_40.len;
            __dest = (uchar *)safemalloc(local_40.len,1,0);
            disp->localauthdata = __dest;
            memcpy(__dest,local_40.ptr,__n);
            disp->localauthdatalen = (int)pVar12.len;
          }
        }
      }
    } while (BVar1 == BSE_NO_ERROR);
    fclose(__stream);
    smemclr(__ptr,0x8000c);
    safefree(__ptr);
    safefree(str);
  }
  return;
}

Assistant:

void x11_get_auth_from_authfile(struct X11Display *disp,
                                const char *authfilename)
{
    FILE *authfp;
    char *buf;
    int size;
    BinarySource src[1];
    int family, protocol;
    ptrlen addr, protoname, data;
    char *displaynum_string;
    int displaynum;
    bool ideal_match = false;
    char *ourhostname;

    /* A maximally sized (wildly implausible) .Xauthority record
     * consists of a 16-bit integer to start with, then four strings,
     * each of which has a 16-bit length field followed by that many
     * bytes of data (i.e. up to 0xFFFF bytes). */
    const size_t MAX_RECORD_SIZE = 2 + 4 * (2+0xFFFF);

    /* We'll want a buffer of twice that size (see below). */
    const size_t BUF_SIZE = 2 * MAX_RECORD_SIZE;

    /*
     * Normally we should look for precisely the details specified in
     * `disp'. However, there's an oddity when the display is local:
     * displays like "localhost:0" usually have their details stored
     * in a Unix-domain-socket record (even if there isn't actually a
     * real Unix-domain socket available, as with OpenSSH's proxy X11
     * server).
     *
     * This is apparently a fudge to get round the meaninglessness of
     * "localhost" in a shared-home-directory context -- xauth entries
     * for Unix-domain sockets already disambiguate this by storing
     * the *local* hostname in the conveniently-blank hostname field,
     * but IP "localhost" records couldn't do this. So, typically, an
     * IP "localhost" entry in the auth database isn't present and if
     * it were it would be ignored.
     *
     * However, we don't entirely trust that (say) Windows X servers
     * won't rely on a straight "localhost" entry, bad idea though
     * that is; so if we can't find a Unix-domain-socket entry we'll
     * fall back to an IP-based entry if we can find one.
     */
    bool localhost = !disp->unixdomain && sk_address_is_local(disp->addr);

    authfp = fopen(authfilename, "rb");
    if (!authfp)
        return;

    ourhostname = get_hostname();

    /*
     * Allocate enough space to hold two maximally sized records, so
     * that a full record can start anywhere in the first half. That
     * way we avoid the accidentally-quadratic algorithm that would
     * arise if we moved everything to the front of the buffer after
     * consuming each record; instead, we only move everything to the
     * front after our current position gets past the half-way mark.
     * Before then, there's no need to move anyway; so this guarantees
     * linear time, in that every byte written into this buffer moves
     * at most once (because every move is from the second half of the
     * buffer to the first half).
     */
    buf = snewn(BUF_SIZE, char);
    size = fread(buf, 1, BUF_SIZE, authfp);
    BinarySource_BARE_INIT(src, buf, size);

    while (!ideal_match) {
        bool match = false;

        if (src->pos >= MAX_RECORD_SIZE) {
            size -= src->pos;
            memcpy(buf, buf + src->pos, size);
            size += fread(buf + size, 1, BUF_SIZE - size, authfp);
            BinarySource_BARE_INIT(src, buf, size);
        }

        family = get_uint16(src);
        addr = get_string_xauth(src);
        displaynum_string = mkstr(get_string_xauth(src));
        displaynum = displaynum_string[0] ? atoi(displaynum_string) : -1;
        sfree(displaynum_string);
        protoname = get_string_xauth(src);
        data = get_string_xauth(src);
        if (get_err(src))
            break;

        /*
         * Now we have a full X authority record in memory. See
         * whether it matches the display we're trying to
         * authenticate to.
         *
         * The details we've just read should be interpreted as
         * follows:
         *
         *  - 'family' is the network address family used to
         *    connect to the display. 0 means IPv4; 6 means IPv6;
         *    256 means Unix-domain sockets.
         *
         *  - 'addr' is the network address itself. For IPv4 and
         *    IPv6, this is a string of binary data of the
         *    appropriate length (respectively 4 and 16 bytes)
         *    representing the address in big-endian format, e.g.
         *    7F 00 00 01 means IPv4 localhost. For Unix-domain
         *    sockets, this is the host name of the machine on
         *    which the Unix-domain display resides (so that an
         *    .Xauthority file on a shared file system can contain
         *    authority entries for Unix-domain displays on
         *    several machines without them clashing).
         *
         *  - 'displaynum' is the display number. An empty display
         *    number is a wildcard for any display number.
         *
         *  - 'protoname' is the authorisation protocol, encoded as
         *    its canonical string name (i.e. "MIT-MAGIC-COOKIE-1",
         *    "XDM-AUTHORIZATION-1" or something we don't recognise).
         *
         *  - 'data' is the actual authorisation data, stored in
         *    binary form.
         */

        if (disp->displaynum < 0 ||
            (displaynum >= 0 && disp->displaynum != displaynum))
            continue;                  /* not the one */

        for (protocol = 1; protocol < lenof(x11_authnames); protocol++)
            if (ptrlen_eq_string(protoname, x11_authnames[protocol]))
                break;
        if (protocol == lenof(x11_authnames))
            continue;  /* don't recognise this protocol, look for another */

        switch (family) {
          case 0:   /* IPv4 */
            if (!disp->unixdomain &&
                sk_addrtype(disp->addr) == ADDRTYPE_IPV4) {
                char buf[4];
                sk_addrcopy(disp->addr, buf);
                if (addr.len == 4 && !memcmp(addr.ptr, buf, 4)) {
                    match = true;
                    /* If this is a "localhost" entry, note it down
                     * but carry on looking for a Unix-domain entry. */
                    ideal_match = !localhost;
                }
            }
            break;
          case 6:   /* IPv6 */
            if (!disp->unixdomain &&
                sk_addrtype(disp->addr) == ADDRTYPE_IPV6) {
                char buf[16];
                sk_addrcopy(disp->addr, buf);
                if (addr.len == 16 && !memcmp(addr.ptr, buf, 16)) {
                    match = true;
                    ideal_match = !localhost;
                }
            }
            break;
          case 256: /* Unix-domain / localhost */
            if ((disp->unixdomain || localhost)
                && ourhostname && ptrlen_eq_string(addr, ourhostname)) {
                /* A matching Unix-domain socket is always the best
                 * match. */
                match = true;
                ideal_match = true;
            }
            break;
        }

        if (match) {
            /* Current best guess -- may be overridden if !ideal_match */
            disp->localauthproto = protocol;
            sfree(disp->localauthdata); /* free previous guess, if any */
            disp->localauthdata = snewn(data.len, unsigned char);
            memcpy(disp->localauthdata, data.ptr, data.len);
            disp->localauthdatalen = data.len;
        }
    }

    fclose(authfp);
    smemclr(buf, 2 * MAX_RECORD_SIZE);
    sfree(buf);
    sfree(ourhostname);
}